

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O0

vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
cfd::core::GetElementsAddressFormatList(void)

{
  initializer_list<cfd::core::AddressFormatData> __l;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *in_RDI;
  AddressFormatData *local_128;
  allocator<cfd::core::AddressFormatData> local_eb;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8;
  allocator local_b1;
  string local_b0;
  AddressFormatData *local_90;
  AddressFormatData local_88;
  AddressFormatData local_58;
  iterator local_28;
  size_type local_20;
  undefined1 local_11;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *result;
  
  local_11 = 0;
  local_ea = 1;
  local_90 = &local_88;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_b0,"liquidv1",&local_b1);
  AddressFormatData::AddressFormatData(&local_88,&local_b0);
  local_90 = &local_58;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_e8,"elementsregtest",&local_e9);
  AddressFormatData::AddressFormatData(&local_58,&local_e8);
  local_ea = 0;
  local_28 = &local_88;
  local_20 = 2;
  ::std::allocator<cfd::core::AddressFormatData>::allocator(&local_eb);
  __l._M_len = local_20;
  __l._M_array = local_28;
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (in_RDI,__l,&local_eb);
  ::std::allocator<cfd::core::AddressFormatData>::~allocator
            ((allocator<cfd::core::AddressFormatData> *)0x49bfb0);
  local_128 = (AddressFormatData *)&local_28;
  do {
    local_128 = local_128 + -1;
    AddressFormatData::~AddressFormatData((AddressFormatData *)0x49bfdd);
  } while (local_128 != &local_88);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  return in_RDI;
}

Assistant:

std::vector<AddressFormatData> GetElementsAddressFormatList() {
  std::vector<AddressFormatData> result = {
      AddressFormatData(kNettypeLiquidV1),
      AddressFormatData(kNettypeElementsRegtest)};
  return result;
}